

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O2

void __thiscall helics::CommsInterface::setFlag(CommsInterface *this,string_view flag,bool val)

{
  bool bVar1;
  string_view message_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  allocator<char> local_49;
  string_view flag_local;
  string message;
  
  flag_local._M_str = flag._M_str;
  flag_local._M_len = flag._M_len;
  __y._M_str = "server_mode";
  __y._M_len = 0xb;
  bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)flag,__y);
  if (bVar1) {
    setServerMode(this,val);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&message,"unrecognized flag :",&local_49);
  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&message,&flag_local);
  message_00._M_str = message._M_dataplus._M_p;
  message_00._M_len = message._M_string_length;
  logWarning(this,message_00);
  std::__cxx11::string::~string((string *)&message);
  return;
}

Assistant:

void CommsInterface::setFlag(std::string_view flag, bool val)
{
    if (flag == "server_mode") {
        setServerMode(val);
    } else {
        std::string message("unrecognized flag :");
        message.append(flag);
        logWarning(message);
    }
}